

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_common.cc
# Opt level: O1

size_t woff2::CollectionHeaderSize(uint32_t header_version,uint32_t num_fonts)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar1 = (ulong)(num_fonts * 4 + 0xc);
  uVar3 = 0;
  if (header_version == 0x20000) {
    uVar3 = uVar1;
  }
  if (header_version == 0x10000) {
    uVar3 = uVar1;
  }
  sVar2 = uVar3 + 0xc;
  if (header_version != 0x20000) {
    sVar2 = uVar3;
  }
  return sVar2;
}

Assistant:

size_t CollectionHeaderSize(uint32_t header_version, uint32_t num_fonts) {
  size_t size = 0;
  if (header_version == 0x00020000) {
    size += 12;  // ulDsig{Tag,Length,Offset}
  }
  if (header_version == 0x00010000 || header_version == 0x00020000) {
    size += 12   // TTCTag, Version, numFonts
      + 4 * num_fonts;  // OffsetTable[numFonts]
  }
  return size;
}